

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.h
# Opt level: O0

void __thiscall
cmDocumentation::SetSection<cmDocumentationEntry>
          (cmDocumentation *this,char *sectionName,cmDocumentationEntry *docs)

{
  cmDocumentationSection local_a0;
  undefined1 local_58 [8];
  cmDocumentationSection sec;
  cmDocumentationEntry *docs_local;
  char *sectionName_local;
  cmDocumentation *this_local;
  
  sec.Entries.super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = docs;
  cmDocumentationSection::cmDocumentationSection((cmDocumentationSection *)local_58,sectionName);
  cmDocumentationSection::Append
            ((cmDocumentationSection *)local_58,
             sec.Entries.
             super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage);
  cmDocumentationSection::cmDocumentationSection(&local_a0,(cmDocumentationSection *)local_58);
  SetSection(this,sectionName,&local_a0);
  cmDocumentationSection::~cmDocumentationSection(&local_a0);
  cmDocumentationSection::~cmDocumentationSection((cmDocumentationSection *)local_58);
  return;
}

Assistant:

void SetSection(const char* sectionName, const Iterable& docs)
  {
    cmDocumentationSection sec{ sectionName };
    sec.Append(docs);
    this->SetSection(sectionName, std::move(sec));
  }